

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

t_object * xemmai::t_type_of<std::filesystem::perms>::f_define(t_library *a_library)

{
  t_object *ptVar1;
  t_library *a_library_local;
  
  ptVar1 = t_enum_of<std::filesystem::perms,xemmai::t_os>::
           f_define<xemmai::t_type_of<std::filesystem::perms>::f_define(xemmai::t_os*)::_lambda(auto:1)_1_>
                     (a_library);
  return ptVar1;
}

Assistant:

static t_object* f_define(t_library* a_library)
	{
		return t_base::f_define(a_library, [](auto a_fields)
		{
			a_fields
			(L"NONE"sv, std::filesystem::perms::none)
			(L"OWNER_READ"sv, std::filesystem::perms::owner_read)
			(L"OWNER_WRITE"sv, std::filesystem::perms::owner_write)
			(L"OWNER_EXEC"sv, std::filesystem::perms::owner_exec)
			(L"OWNER_ALL"sv, std::filesystem::perms::owner_all)
			(L"GROUP_READ"sv, std::filesystem::perms::group_read)
			(L"GROUP_WRITE"sv, std::filesystem::perms::group_write)
			(L"GROUP_EXEC"sv, std::filesystem::perms::group_exec)
			(L"GROUP_ALL"sv, std::filesystem::perms::group_all)
			(L"OTHERS_READ"sv, std::filesystem::perms::others_read)
			(L"OTHERS_WRITE"sv, std::filesystem::perms::others_write)
			(L"OTHERS_EXEC"sv, std::filesystem::perms::others_exec)
			(L"OTHERS_ALL"sv, std::filesystem::perms::others_all)
			(L"ALL"sv, std::filesystem::perms::all)
			(L"SET_UID"sv, std::filesystem::perms::set_uid)
			(L"SET_GID"sv, std::filesystem::perms::set_gid)
			(L"STICKY_BIT"sv, std::filesystem::perms::sticky_bit)
			(L"MASK"sv, std::filesystem::perms::mask)
			;
		});
	}